

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sift.cc
# Opt level: O3

void __thiscall features::Sift::keypoint_localization(Sift *this)

{
  int *piVar1;
  float fVar2;
  int iVar3;
  long lVar4;
  pointer pKVar5;
  long lVar6;
  long lVar7;
  ostream *poVar8;
  int iVar9;
  ImageVector *pIVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  size_type __new_size;
  Keypoints *this_00;
  int iVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  int iVar19;
  ulong uVar20;
  float fVar21;
  float fVar22;
  Matrix3f H_inv;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  long local_c8;
  ConstPtr dogs [3];
  undefined1 local_8c [8];
  Matrix3f H;
  float local_5c;
  float local_58;
  float detH;
  float local_50;
  int local_4c;
  ulong local_48;
  ulong local_40;
  int local_34;
  
  this_00 = &this->keypoints;
  pKVar5 = (this->keypoints).
           super__Vector_base<features::Sift::Keypoint,_std::allocator<features::Sift::Keypoint>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->keypoints).
      super__Vector_base<features::Sift::Keypoint,_std::allocator<features::Sift::Keypoint>_>.
      _M_impl.super__Vector_impl_data._M_finish == pKVar5) {
    __new_size = 0;
    iVar13 = 0;
  }
  else {
    local_48 = 0;
    local_40 = 0;
    uVar20 = 0;
    H.m._28_8_ = this_00;
    do {
      fVar22 = pKVar5[uVar20].x;
      fVar2 = pKVar5[uVar20].y;
      dogs[2].super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(long)pKVar5[uVar20].octave;
      local_34 = (int)pKVar5[uVar20].sample;
      pIVar10 = &(this->octaves).
                 super__Vector_base<features::Sift::Octave,_std::allocator<features::Sift::Octave>_>
                 ._M_impl.super__Vector_impl_data._M_start
                 [(long)pKVar5[uVar20].octave - (long)(this->options).min_octave].dog;
      lVar14 = *(long *)&(pIVar10->
                         super__Vector_base<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
                         )._M_impl.super__Vector_impl_data;
      lVar6 = (long)local_34 * 0x10;
      local_c8 = *(long *)(lVar14 + lVar6);
      dogs[0].super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(element_type **)(lVar14 + 8 + lVar6);
      if (dogs[0].super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          piVar1 = &((dogs[0].
                      super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->super_TypedImageBase<float>).super_ImageBase.w;
          *piVar1 = *piVar1 + 1;
          UNLOCK();
          lVar14 = *(long *)&(pIVar10->
                             super__Vector_base<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
                             )._M_impl.super__Vector_impl_data;
        }
        else {
          piVar1 = &((dogs[0].
                      super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->super_TypedImageBase<float>).super_ImageBase.w;
          *piVar1 = *piVar1 + 1;
        }
      }
      dogs[0].super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar14 + 0x10 + lVar6);
      dogs[1].super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(element_type **)(lVar14 + 0x18 + lVar6);
      if (dogs[1].super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          piVar1 = &((dogs[1].
                      super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->super_TypedImageBase<float>).super_ImageBase.w;
          *piVar1 = *piVar1 + 1;
          UNLOCK();
          lVar14 = *(long *)&(pIVar10->
                             super__Vector_base<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
                             )._M_impl.super__Vector_impl_data;
        }
        else {
          piVar1 = &((dogs[1].
                      super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->super_TypedImageBase<float>).super_ImageBase.w;
          *piVar1 = *piVar1 + 1;
        }
      }
      dogs[1].super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar14 + 0x20 + lVar6);
      dogs[2].super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(element_type **)(lVar14 + 0x28 + lVar6);
      if (dogs[2].super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          piVar1 = &((dogs[2].
                      super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->super_TypedImageBase<float>).super_ImageBase.w;
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        else {
          piVar1 = &((dogs[2].
                      super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->super_TypedImageBase<float>).super_ImageBase.w;
          *piVar1 = *piVar1 + 1;
        }
      }
      iVar3 = *(int *)(local_c8 + 8);
      local_4c = *(int *)(local_c8 + 0xc);
      iVar19 = (int)fVar22;
      iVar12 = (int)fVar2;
      iVar15 = iVar3 * iVar12;
      iVar13 = iVar15 + iVar19;
      lVar17 = (long)iVar13;
      iVar9 = iVar15 + iVar19 + 1;
      lVar11 = (long)iVar9;
      lVar14 = *(long *)&dogs[0].
                         super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi[1]._M_use_count;
      iVar15 = iVar15 + -1 + iVar19;
      lVar16 = (long)iVar15;
      lVar7 = (long)(iVar13 + iVar3);
      lVar6 = *(long *)&dogs[1].
                        super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi[1]._M_use_count;
      lVar4 = *(long *)(local_c8 + 0x18);
      lVar18 = (long)(iVar13 - iVar3);
      fVar22 = *(float *)(lVar14 + lVar17 * 4) * -2.0;
      local_8c._0_4_ = *(float *)(lVar14 + lVar11 * 4) + *(float *)(lVar14 + lVar16 * 4) + fVar22;
      H.m[2] = *(float *)(lVar14 + lVar7 * 4) + *(float *)(lVar14 + lVar18 * 4) + fVar22;
      H.m[6] = *(float *)(lVar6 + lVar17 * 4) + *(float *)(lVar4 + lVar17 * 4) + fVar22;
      local_8c._4_4_ =
           (((*(float *)(lVar14 + (long)(iVar3 + iVar13 + 1) * 4) +
             *(float *)(lVar14 + (long)(iVar15 - iVar3) * 4)) -
            *(float *)(lVar14 + (long)(iVar3 + iVar13 + -1) * 4)) -
           *(float *)(lVar14 + (long)(iVar9 - iVar3) * 4)) * 0.25;
      H.m[0] = (((*(float *)(lVar6 + lVar11 * 4) + *(float *)(lVar4 + lVar16 * 4)) -
                *(float *)(lVar6 + lVar16 * 4)) - *(float *)(lVar4 + lVar11 * 4)) * 0.25;
      H.m[3] = (((*(float *)(lVar6 + lVar7 * 4) + *(float *)(lVar4 + lVar18 * 4)) -
                *(float *)(lVar6 + lVar18 * 4)) - *(float *)(lVar4 + lVar7 * 4)) * 0.25;
      local_50 = (float)local_8c._0_4_ * H.m[2];
      fVar22 = -(float)local_8c._4_4_ * (float)local_8c._4_4_;
      uStack_d0 = 0x80000000;
      uStack_cc = 0x80000000;
      local_5c = (H.m[6] * fVar22 +
                 (((float)local_8c._4_4_ * H.m[0] * H.m[3] +
                  local_50 * H.m[6] + (float)local_8c._4_4_ * H.m[3] * H.m[0]) -
                 H.m[2] * H.m[0] * H.m[0])) - H.m[3] * (float)local_8c._0_4_ * H.m[3];
      H.m[1] = (float)local_8c._4_4_;
      H.m[4] = H.m[0];
      H.m[5] = H.m[3];
      local_58 = (float)local_8c._0_4_;
      detH = H.m[2];
      if (ABS(local_5c) <= 1e-15) {
        local_48 = (ulong)((int)local_48 + 1);
      }
      else {
        math::matrix_inverse<float>((Matrix<float,_3,_3> *)local_8c,&local_5c);
      }
      if (((this->options).contrast_threshold <= 0.0) &&
         (fVar22 = ((local_58 + detH) * (local_58 + detH)) / (local_50 + fVar22), 0.0 <= fVar22)) {
        fVar2 = (this->options).edge_ratio_threshold;
        fVar21 = fVar2 + 1.0;
        if (((-2 < local_34) &&
            (((fVar22 <= (fVar21 * fVar21) / fVar2 && (-1 < iVar19)) &&
             ((float)local_34 <= (float)(this->options).num_samples_per_octave)))) &&
           (((-1 < iVar12 && ((float)iVar19 <= (float)(iVar3 + -1))) &&
            ((float)iVar12 <= (float)(local_4c + -1))))) {
          lVar14 = *(long *)H.m._28_8_;
          lVar6 = (long)(int)local_40 * 0x10;
          *(int *)(lVar14 + lVar6) =
               (int)dogs[2].super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
          *(float *)(lVar14 + 4 + lVar6) = (float)local_34;
          *(float *)(lVar14 + 8 + lVar6) = (float)iVar19;
          *(float *)(lVar14 + 0xc + lVar6) = (float)iVar12;
          local_40 = (ulong)((int)local_40 + 1);
        }
      }
      lVar14 = 0x30;
      do {
        if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&uStack_d0 + lVar14) !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&uStack_d0 + lVar14));
        }
        lVar14 = lVar14 + -0x10;
      } while (lVar14 != 0);
      uVar20 = uVar20 + 1;
      pKVar5 = (this->keypoints).
               super__Vector_base<features::Sift::Keypoint,_std::allocator<features::Sift::Keypoint>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar20 < (ulong)((long)(this->keypoints).
                                    super__Vector_base<features::Sift::Keypoint,_std::allocator<features::Sift::Keypoint>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pKVar5 >> 4))
    ;
    __new_size = (size_type)(int)local_40;
    iVar13 = (int)local_48;
    this_00 = (Keypoints *)H.m._28_8_;
  }
  std::vector<features::Sift::Keypoint,_std::allocator<features::Sift::Keypoint>_>::resize
            (this_00,__new_size);
  if (((this->options).debug_output & 0 < iVar13) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"SIFT: Warning: ",0xf);
    poVar8 = (ostream *)std::ostream::operator<<(&std::cout,iVar13);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," singular matrices detected!",0x1c);
    std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
  }
  return;
}

Assistant:

void
Sift::keypoint_localization (void)
{
    /*
     * Iterate over all keypoints, accurately localize minima and maxima
     * in the DoG function by fitting a quadratic Taylor polynomial
     * around the keypoint.
     */

    int num_singular = 0;
    int num_keypoints = 0; // Write iterator
    for (std::size_t i = 0; i < this->keypoints.size(); ++i)
    {
        /* Copy keypoint. */
        Keypoint kp(this->keypoints[i]);

        /* Get corresponding octave and DoG images. */
        Octave const& oct(this->octaves[kp.octave - this->options.min_octave]);
        int sample = static_cast<int>(kp.sample);
        core::FloatImage::ConstPtr dogs[3] = { oct.dog[sample + 0], oct.dog[sample + 1], oct.dog[sample + 2] };

        /* Shorthand for image width and height. */
        int const w = dogs[0]->width();
        int const h = dogs[0]->height();
        /* The integer and floating point location of the keypoints. */
        int ix = static_cast<int>(kp.x);
        int iy = static_cast<int>(kp.y);
        int is = static_cast<int>(kp.sample);
        float delta_x, delta_y, delta_s;
        /* The first and second order derivatives. */
        float Dx, Dy, Ds;
        float Dxx, Dyy, Dss;
        float Dxy, Dxs, Dys;

        /*
         * Locate the keypoint using second order Taylor approximation.
         * The procedure might get iterated around a neighboring pixel if
         * the accurate keypoint is off by >0.6 from the center pixel.
         */
#       define AT(S,OFF) (dogs[S]->at(px + OFF))
        for (int j = 0; j < 5; ++j)
        {
            std::size_t px = iy * w + ix;

            /* Compute first and second derivatives. */
            Dx = (AT(1,1) - AT(1,-1)) * 0.5f;
            Dy = (AT(1,w) - AT(1,-w)) * 0.5f;
            Ds = (AT(2,0) - AT(0,0))  * 0.5f;

            Dxx = AT(1,1) + AT(1,-1) - 2.0f * AT(1,0);
            Dyy = AT(1,w) + AT(1,-w) - 2.0f * AT(1,0);
            Dss = AT(2,0) + AT(0,0)  - 2.0f * AT(1,0);

            Dxy = (AT(1,1+w) + AT(1,-1-w) - AT(1,-1+w) - AT(1,1-w)) * 0.25f;
            Dxs = (AT(2,1)   + AT(0,-1)   - AT(2,-1)   - AT(0,1))   * 0.25f;
            Dys = (AT(2,w)   + AT(0,-w)   - AT(2,-w)   - AT(0,w))   * 0.25f;

            /* Setup the Hessian matrix. */
            math::Matrix3f H;
            /****************************task-1-0  构造Hessian矩阵 ******************************/
            /*
             * 参考第32页slide的Hessian矩阵构造方式填充H矩阵，其中dx=dy=d_sigma=1, 其中A矩阵按照行顺序存储，即
             * H=[H[0], H[1], H[2]]
             *   [H[3], H[4], H[5]]
             *   [H[6], H[7], H[8]]
             */

            /**********************************************************************************/
            H[0] = Dxx; H[1] = Dxy; H[2] = Dxs;
            H[3] = Dxy; H[4] = Dyy; H[5] = Dys;
            H[6] = Dxs; H[7] = Dys; H[8] = Dss;


            /* Compute determinant to detect singular matrix. */
            float detH = math::matrix_determinant(H);
            if (MATH_EPSILON_EQ(detH, 0.0f, 1e-15f))
            {
                num_singular += 1;
                delta_x = delta_y = delta_s = 0.0f; // FIXME: Handle this case?
                break;
            }
            /* Invert the matrix to get the accurate keypoint. */
            math::Matrix3f H_inv = math::matrix_inverse(H, detH);
            math::Vec3f b(-Dx, -Dy, -Ds);


            math::Vec3f delta;
            /****************************task-1-1  求解偏移量deta ******************************/
            /*
             * 参考第30页slide delta_x的求解方式 delta_x = inv(H)*b
             * 请在此处给出delta的表达式
                     /*                  */
                     /*    此处添加代码    */
                     /*                  */
            /**********************************************************************************/


            //math::Vec3f delta = H_inv * b;
            delta_x = delta[0];
            delta_y = delta[1];
            delta_s = delta[2];


            /* Check if accurate location is far away from pixel center. */
            // dx =0 表示|dx|>0.6f
            int dx = (delta_x > 0.6f && ix < w-2) * 1 + (delta_x < -0.6f && ix > 1) * -1;
            int dy = (delta_y > 0.6f && iy < h-2) * 1 + (delta_y < -0.6f && iy > 1) * -1;

            /* If the accurate location is closer to another pixel,
             * repeat localization around the other pixel. */
            if (dx != 0 || dy != 0)
            {
                ix += dx;
                iy += dy;
                continue;
            }
            /* Accurate location looks good. */
            break;
        }




        /* Calcualte function value D(x) at accurate keypoint x. */
        /*****************************task1-2求解极值点处的DoG值val ***************************/
         /*
          * 参考第30页slides的机极值点f(x)的求解公式f(x) = f(x0) + 0.5* delta.dot(D)
          * 其中
          * f(x0)--表示插值点(ix, iy, is) 处的DoG值，可通过dogs[1]->at(ix, iy, 0)获取
          * delta--为上述求得的delta=[delta_x, delta_y, delta_s]
          * D--为一阶导数，表示为(Dx, Dy, Ds)
          * 请给出求解val的代码
          */
        float val = 0.0;
        /*                  */
        /*    此处添加代码    */
        /*                  */
        /************************************************************************************/



        //float val = dogs[1]->at(ix, iy, 0) + 0.5f * (Dx * delta_x + Dy * delta_y + Ds * delta_s);
        /* Calcualte edge response score Tr(H)^2 / Det(H), see Section 4.1. */
         /**************************去除边缘点，参考第33页slide 仔细阅读代码 ****************************/
        float hessian_trace = Dxx + Dyy;
        float hessian_det = Dxx * Dyy - MATH_POW2(Dxy);
        float hessian_score = MATH_POW2(hessian_trace) / hessian_det;
        float score_thres = MATH_POW2(this->options.edge_ratio_threshold + 1.0f)
            / this->options.edge_ratio_threshold;
        /********************************************************************************/

        /*
         * Set accurate final keypoint location.
         */
        kp.x = (float)ix + delta_x;
        kp.y = (float)iy + delta_y;
        kp.sample = (float)is + delta_s;

        /*
         * Discard keypoints with:
         * 1. low contrast (value of DoG function at keypoint),
         * 2. negative hessian determinant (curvatures with different sign),
         *    Note that negative score implies negative determinant.
         * 3. large edge response (large hessian score),
         * 4. unstable keypoint accurate locations,
         * 5. keypoints beyond the scale space boundary.
         */
        if (std::abs(val) < this->options.contrast_threshold
            || hessian_score < 0.0f || hessian_score > score_thres
            || std::abs(delta_x) > 1.5f || std::abs(delta_y) > 1.5f || std::abs(delta_s) > 1.0f
            || kp.sample < -1.0f
            || kp.sample > (float)this->options.num_samples_per_octave
            || kp.x < 0.0f || kp.x > (float)(w - 1)
            || kp.y < 0.0f || kp.y > (float)(h - 1))
        {
            //std::cout << " REJECTED!" << std::endl;
            continue;
        }

        /* Keypoint is accepted, copy to write iter and advance. */
        this->keypoints[num_keypoints] = kp;
        num_keypoints += 1;
    }

    /* Limit vector size to number of accepted keypoints. */
    this->keypoints.resize(num_keypoints);

    if (this->options.debug_output && num_singular > 0)
    {
        std::cout << "SIFT: Warning: " << num_singular
            << " singular matrices detected!" << std::endl;
    }
}